

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Kernel::MergeFrom(Kernel *this,Kernel *from)

{
  void *pvVar1;
  LogMessage *other;
  LinearKernel *this_00;
  LinearKernel *from_00;
  PolyKernel *this_01;
  PolyKernel *from_01;
  SigmoidKernel *this_02;
  SigmoidKernel *from_02;
  RBFKernel *this_03;
  RBFKernel *from_03;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/SVM.pb.cc"
               ,0x510);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    this_00 = mutable_linearkernel(this);
    from_00 = linearkernel(from);
    LinearKernel::MergeFrom(this_00,from_00);
    break;
  case 2:
    this_03 = mutable_rbfkernel(this);
    from_03 = rbfkernel(from);
    RBFKernel::MergeFrom(this_03,from_03);
    break;
  case 3:
    this_01 = mutable_polykernel(this);
    from_01 = polykernel(from);
    PolyKernel::MergeFrom(this_01,from_01);
    break;
  case 4:
    this_02 = mutable_sigmoidkernel(this);
    from_02 = sigmoidkernel(from);
    SigmoidKernel::MergeFrom(this_02,from_02);
  }
  return;
}

Assistant:

void Kernel::MergeFrom(const Kernel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Kernel)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.kernel_case()) {
    case kLinearKernel: {
      mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from.linearkernel());
      break;
    }
    case kRbfKernel: {
      mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from.rbfkernel());
      break;
    }
    case kPolyKernel: {
      mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from.polykernel());
      break;
    }
    case kSigmoidKernel: {
      mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from.sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
}